

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_uintwide_t_edge_cases.cpp
# Opt level: O1

bool test_uintwide_t_edge::test_ops_n_half_by_n_half(void)

{
  ushort *puVar1;
  ushort uVar2;
  ushort uVar3;
  undefined1 auVar4 [16];
  undefined8 uVar5;
  undefined8 uVar6;
  enable_if_t<std::is_integral<int>::value,_bool> eVar7;
  uint uVar8;
  uintwide_t<128U,_unsigned_short,_void,_false> *puVar9;
  uintwide_t<256U,_unsigned_short,_void,_false> *puVar10;
  long lVar11;
  undefined7 extraout_var;
  enable_if_t<(std::is_integral<int>::value_&&_std::is_signed<int>::value),_uintwide_t<128U,_unsigned_short>_>
  *peVar12;
  enable_if_t<(std::is_integral<int>::value_&&_std::is_signed<int>::value),_uintwide_t<256U,_unsigned_short>_>
  *peVar13;
  value_type_conflict3 *pvVar14;
  ulong uVar15;
  char cVar16;
  int i_3;
  byte bVar17;
  uint i_1;
  uint i;
  int iVar18;
  array<unsigned_short,_8UL> aVar19;
  uintwide_t<256U,_unsigned_short,_void,_false> pow_ctrl;
  uintwide_t<256U,_unsigned_short,_void,_false> prod_ctrl;
  uintwide_t<128U,_unsigned_short,_void,_false> right_half;
  uintwide_t<128U,_unsigned_short,_void,_false> x_half;
  uintwide_t<128U,_unsigned_short,_void,_false> zero_half;
  uintwide_t<128U,_unsigned_short,_void,_false> pow_zero_half;
  uintwide_t<256U,_unsigned_short,_void,_false> local_d8;
  array<unsigned_short,_8UL> local_b8;
  value_type_conflict3 local_a8 [8];
  undefined1 local_98 [8];
  value_type_conflict3 avStack_90 [4];
  uintwide_t<256U,_unsigned_short,_void,_false> local_88;
  array<unsigned_short,_8UL> local_68;
  undefined8 local_58;
  undefined8 uStack_50;
  representation_type local_40;
  
  iVar18 = 0;
  uVar15 = 1;
  do {
    aVar19.elems = (value_type_conflict3  [8])
                   generate_wide_integer_value<math::wide_integer::uintwide_t<128u,unsigned_short,void,false>>
                             (true,hex,0xf);
    _local_98 = (value_type_conflict3  [8])
                generate_wide_integer_value<math::wide_integer::uintwide_t<128u,unsigned_short,void,false>>
                          (true,hex,0xf);
    local_d8.values.super_array<unsigned_short,_16UL>.elems._0_16_ = aVar19.elems;
    puVar9 = math::wide_integer::uintwide_t<128U,_unsigned_short,_void,_false>::operator*=
                       ((uintwide_t<128U,_unsigned_short,_void,_false> *)&local_d8,
                        (uintwide_t<128U,_unsigned_short,_void,_false> *)local_98);
    local_58 = *(undefined8 *)(puVar9->values).super_array<unsigned_short,_8UL>.elems;
    uStack_50 = *(undefined8 *)((puVar9->values).super_array<unsigned_short,_8UL>.elems + 4);
    local_88.values.super_array<unsigned_short,_16UL>.elems._0_16_ = _local_98;
    local_88.values.super_array<unsigned_short,_16UL>.elems[8] = 0;
    local_88.values.super_array<unsigned_short,_16UL>.elems[9] = 0;
    local_88.values.super_array<unsigned_short,_16UL>.elems[10] = 0;
    local_88.values.super_array<unsigned_short,_16UL>.elems[0xb] = 0;
    local_88.values.super_array<unsigned_short,_16UL>.elems[0xc] = 0;
    local_88.values.super_array<unsigned_short,_16UL>.elems[0xd] = 0;
    local_88.values.super_array<unsigned_short,_16UL>.elems[0xe] = 0;
    local_88.values.super_array<unsigned_short,_16UL>.elems[0xf] = 0;
    local_d8.values.super_array<unsigned_short,_16UL>.elems[8] = 0;
    local_d8.values.super_array<unsigned_short,_16UL>.elems[9] = 0;
    local_d8.values.super_array<unsigned_short,_16UL>.elems[10] = 0;
    local_d8.values.super_array<unsigned_short,_16UL>.elems[0xb] = 0;
    local_d8.values.super_array<unsigned_short,_16UL>.elems[0xc] = 0;
    local_d8.values.super_array<unsigned_short,_16UL>.elems[0xd] = 0;
    local_d8.values.super_array<unsigned_short,_16UL>.elems[0xe] = 0;
    local_d8.values.super_array<unsigned_short,_16UL>.elems[0xf] = 0;
    local_d8.values.super_array<unsigned_short,_16UL>.elems._0_16_ = aVar19.elems;
    puVar10 = math::wide_integer::uintwide_t<256U,_unsigned_short,_void,_false>::operator*=
                        (&local_d8,&local_88);
    local_b8.elems =
         *(value_type_conflict3 (*) [8])(puVar10->values).super_array<unsigned_short,_16UL>.elems;
    local_a8._0_8_ = *(undefined8 *)((puVar10->values).super_array<unsigned_short,_16UL>.elems + 8);
    local_a8._8_8_ =
         *(undefined8 *)((puVar10->values).super_array<unsigned_short,_16UL>.elems + 0xc);
    local_d8.values.super_array<unsigned_short,_16UL>.elems._8_8_ = uStack_50;
    local_d8.values.super_array<unsigned_short,_16UL>.elems._0_8_ = local_58;
    local_d8.values.super_array<unsigned_short,_16UL>.elems[8] = 0;
    local_d8.values.super_array<unsigned_short,_16UL>.elems[9] = 0;
    local_d8.values.super_array<unsigned_short,_16UL>.elems[10] = 0;
    local_d8.values.super_array<unsigned_short,_16UL>.elems[0xb] = 0;
    local_d8.values.super_array<unsigned_short,_16UL>.elems[0xc] = 0;
    local_d8.values.super_array<unsigned_short,_16UL>.elems[0xd] = 0;
    local_d8.values.super_array<unsigned_short,_16UL>.elems[0xe] = 0;
    local_d8.values.super_array<unsigned_short,_16UL>.elems[0xf] = 0;
    pvVar14 = (value_type_conflict3 *)0x1e;
    do {
      bVar17 = 0;
      if ((uintwide_t<256U,_unsigned_short,_void,_false> *)pvVar14 ==
          (uintwide_t<256U,_unsigned_short,_void,_false> *)0xfffffffffffffffe) break;
      uVar2 = *(ushort *)
               ((long)(((representation_type *)&local_d8)->super_array<unsigned_short,_8UL>).elems +
               (long)pvVar14);
      uVar3 = *(ushort *)((long)local_b8.elems + (long)pvVar14);
      bVar17 = -(uVar2 <= uVar3) | 1;
      pvVar14 = pvVar14 + -1;
    } while (uVar2 == uVar3);
    uVar15 = (ulong)((byte)uVar15 & bVar17 == 0);
    iVar18 = iVar18 + 1;
  } while (iVar18 != 0x18);
  local_98._0_2_ = 2;
  local_98._2_2_ = 0;
  do {
    local_88.values.super_array<unsigned_short,_16UL>.elems._0_16_ =
         generate_wide_integer_value<math::wide_integer::uintwide_t<128u,unsigned_short,void,false>>
                   (true,hex,4);
    aVar19.elems = (value_type_conflict3  [8])
                   math::wide_integer::pow<unsigned_int,128u,unsigned_short,void,false>
                             ((uintwide_t<128U,_unsigned_short,_void,_false> *)&local_88,
                              (uint *)local_98);
    local_b8.elems[0] = local_88.values.super_array<unsigned_short,_16UL>.elems[0];
    local_b8.elems[1] = local_88.values.super_array<unsigned_short,_16UL>.elems[1];
    local_b8.elems[2] = local_88.values.super_array<unsigned_short,_16UL>.elems[2];
    local_b8.elems[3] = local_88.values.super_array<unsigned_short,_16UL>.elems[3];
    local_b8.elems[4] = local_88.values.super_array<unsigned_short,_16UL>.elems[4];
    local_b8.elems[5] = local_88.values.super_array<unsigned_short,_16UL>.elems[5];
    local_b8.elems[6] = local_88.values.super_array<unsigned_short,_16UL>.elems[6];
    local_b8.elems[7] = local_88.values.super_array<unsigned_short,_16UL>.elems[7];
    local_a8[0] = 0;
    local_a8[1] = 0;
    local_a8[2] = 0;
    local_a8[3] = 0;
    local_a8[4] = 0;
    local_a8[5] = 0;
    local_a8[6] = 0;
    local_a8[7] = 0;
    math::wide_integer::pow<unsigned_int,256u,unsigned_short,void,false>
              (&local_d8,(wide_integer *)&local_b8,
               (uintwide_t<256U,_unsigned_short,_void,_false> *)local_98,(uint *)pvVar14);
    local_a8[0] = 0;
    local_a8[1] = 0;
    local_a8[2] = 0;
    local_a8[3] = 0;
    local_a8[4] = 0;
    local_a8[5] = 0;
    local_a8[6] = 0;
    local_a8[7] = 0;
    pvVar14 = (value_type_conflict3 *)0x1e;
    do {
      bVar17 = 0;
      if ((uintwide_t<256U,_unsigned_short,_void,_false> *)pvVar14 ==
          (uintwide_t<256U,_unsigned_short,_void,_false> *)0xfffffffffffffffe) break;
      uVar2 = *(ushort *)((long)local_b8.elems + (long)pvVar14);
      uVar3 = *(ushort *)
               ((long)(((representation_type *)&local_d8)->super_array<unsigned_short,_8UL>).elems +
               (long)pvVar14);
      bVar17 = -(uVar2 <= uVar3) | 1;
      pvVar14 = pvVar14 + -1;
    } while (uVar2 == uVar3);
    uVar15 = (ulong)((byte)uVar15 & bVar17 == 0);
    uVar8 = local_98._0_4_ + 1;
    local_98._0_4_ = uVar8;
    local_b8.elems = aVar19.elems;
  } while (uVar8 < 8);
  iVar18 = 0;
  do {
    _local_98 = (value_type_conflict3  [8])
                generate_wide_integer_value<math::wide_integer::uintwide_t<128u,unsigned_short,void,false>>
                          (true,dec,0x26);
    local_d8.values.super_array<unsigned_short,_16UL>.elems._0_16_ =
         generate_wide_integer_value<math::wide_integer::uintwide_t<128u,unsigned_short,void,false>>
                   (true,dec,0x26);
    local_b8.elems = (value_type_conflict3  [8])ZEXT816(0);
    puVar9 = math::wide_integer::uintwide_t<128U,_unsigned_short,_void,_false>::operator*=
                       ((uintwide_t<128U,_unsigned_short,_void,_false> *)&local_d8,
                        (uintwide_t<128U,_unsigned_short,_void,_false> *)&local_b8);
    local_68.elems = *&(puVar9->values).super_array<unsigned_short,_8UL>.elems;
    local_40.super_array<unsigned_short,_8UL>.elems =
         (array<unsigned_short,_8UL>)
         math::wide_integer::
         pow<math::wide_integer::uintwide_t<128u,unsigned_short,void,false>,128u,unsigned_short,void,false>
                   ((uintwide_t<128U,_unsigned_short,_void,_false> *)local_98,
                    (uintwide_t<128U,_unsigned_short,_void,_false> *)&local_68);
    aVar19.elems = _local_98;
    local_b8.elems[0] = local_98._0_2_;
    local_b8.elems[1] = local_98._2_2_;
    local_b8.elems[2] = local_98._4_2_;
    local_b8.elems[3] = local_98._6_2_;
    local_b8.elems[4] = avStack_90[0];
    local_b8.elems[5] = avStack_90[1];
    local_b8.elems[6] = avStack_90[2];
    local_b8.elems[7] = avStack_90[3];
    local_a8[0] = 0;
    local_a8[1] = 0;
    local_a8[2] = 0;
    local_a8[3] = 0;
    local_a8[4] = 0;
    local_a8[5] = 0;
    local_a8[6] = 0;
    local_a8[7] = 0;
    local_88.values.super_array<unsigned_short,_16UL>.elems[0] = local_68.elems[0];
    local_88.values.super_array<unsigned_short,_16UL>.elems[1] = local_68.elems[1];
    local_88.values.super_array<unsigned_short,_16UL>.elems[2] = local_68.elems[2];
    local_88.values.super_array<unsigned_short,_16UL>.elems[3] = local_68.elems[3];
    local_88.values.super_array<unsigned_short,_16UL>.elems[4] = local_68.elems[4];
    local_88.values.super_array<unsigned_short,_16UL>.elems[5] = local_68.elems[5];
    local_88.values.super_array<unsigned_short,_16UL>.elems[6] = local_68.elems[6];
    local_88.values.super_array<unsigned_short,_16UL>.elems[7] = local_68.elems[7];
    local_88.values.super_array<unsigned_short,_16UL>.elems[8] = 0;
    local_88.values.super_array<unsigned_short,_16UL>.elems[9] = 0;
    local_88.values.super_array<unsigned_short,_16UL>.elems[10] = 0;
    local_88.values.super_array<unsigned_short,_16UL>.elems[0xb] = 0;
    local_88.values.super_array<unsigned_short,_16UL>.elems[0xc] = 0;
    local_88.values.super_array<unsigned_short,_16UL>.elems[0xd] = 0;
    local_88.values.super_array<unsigned_short,_16UL>.elems[0xe] = 0;
    local_88.values.super_array<unsigned_short,_16UL>.elems[0xf] = 0;
    _local_98 = aVar19.elems;
    math::wide_integer::
    pow<math::wide_integer::uintwide_t<256u,unsigned_short,void,false>,256u,unsigned_short,void,false>
              (&local_d8,(wide_integer *)&local_b8,&local_88,
               (uintwide_t<256U,_unsigned_short,_void,_false> *)pvVar14);
    local_b8 = local_40.super_array<unsigned_short,_8UL>.elems;
    local_a8[0] = 0;
    local_a8[1] = 0;
    local_a8[2] = 0;
    local_a8[3] = 0;
    local_a8[4] = 0;
    local_a8[5] = 0;
    local_a8[6] = 0;
    local_a8[7] = 0;
    lVar11 = 0x1e;
    do {
      bVar17 = 0;
      if (lVar11 == -2) break;
      uVar2 = *(ushort *)((long)local_b8.elems + lVar11);
      pvVar14 = (value_type_conflict3 *)(ulong)uVar2;
      uVar3 = *(ushort *)
               ((long)(((representation_type *)&local_d8)->super_array<unsigned_short,_8UL>).elems +
               lVar11);
      bVar17 = -(uVar2 <= uVar3) | 1;
      lVar11 = lVar11 + -2;
    } while (uVar2 == uVar3);
    if (bVar17 == 0) {
      local_88.values.super_array<unsigned_short,_16UL>.elems._0_4_ = 1;
      eVar7 = math::wide_integer::operator==
                        ((uintwide_t<128U,_unsigned_short,_void,_false> *)&local_40,(int *)&local_88
                        );
      uVar15 = CONCAT71(extraout_var,eVar7 & (byte)uVar15) & 0xffffffff;
    }
    else {
      uVar15 = 0;
    }
    iVar18 = iVar18 + 1;
  } while (iVar18 != 8);
  puVar10 = (uintwide_t<256U,_unsigned_short,_void,_false> *)0x3;
  do {
    local_58 = CONCAT44(local_58._4_4_,(int)uVar15);
    local_88.values.super_array<unsigned_short,_16UL>.elems._0_16_ =
         generate_wide_integer_value<math::wide_integer::uintwide_t<128u,unsigned_short,void,false>>
                   (true,dec,0x26);
    aVar19.elems = (value_type_conflict3  [8])
                   math::wide_integer::rootk<128u,unsigned_short,void,false>
                             ((uintwide_t<128U,_unsigned_short,_void,_false> *)&local_88,
                              (uint_fast8_t)puVar10);
    local_b8.elems[0] = local_88.values.super_array<unsigned_short,_16UL>.elems[0];
    local_b8.elems[1] = local_88.values.super_array<unsigned_short,_16UL>.elems[1];
    local_b8.elems[2] = local_88.values.super_array<unsigned_short,_16UL>.elems[2];
    local_b8.elems[3] = local_88.values.super_array<unsigned_short,_16UL>.elems[3];
    local_b8.elems[4] = local_88.values.super_array<unsigned_short,_16UL>.elems[4];
    local_b8.elems[5] = local_88.values.super_array<unsigned_short,_16UL>.elems[5];
    local_b8.elems[6] = local_88.values.super_array<unsigned_short,_16UL>.elems[6];
    local_b8.elems[7] = local_88.values.super_array<unsigned_short,_16UL>.elems[7];
    local_a8[0] = 0;
    local_a8[1] = 0;
    local_a8[2] = 0;
    local_a8[3] = 0;
    local_a8[4] = 0;
    local_a8[5] = 0;
    local_a8[6] = 0;
    local_a8[7] = 0;
    math::wide_integer::rootk<256u,unsigned_short,void,false>
              (&local_d8,(wide_integer *)&local_b8,puVar10,(uint_fast8_t)pvVar14);
    local_a8[0] = 0;
    local_a8[1] = 0;
    local_a8[2] = 0;
    local_a8[3] = 0;
    local_a8[4] = 0;
    local_a8[5] = 0;
    local_a8[6] = 0;
    local_a8[7] = 0;
    lVar11 = 0x1e;
    do {
      bVar17 = 0;
      if (lVar11 == -2) break;
      uVar2 = *(ushort *)((long)local_b8.elems + lVar11);
      pvVar14 = (value_type_conflict3 *)(ulong)uVar2;
      uVar3 = *(ushort *)
               ((long)(((representation_type *)&local_d8)->super_array<unsigned_short,_8UL>).elems +
               lVar11);
      bVar17 = -(uVar2 <= uVar3) | 1;
      lVar11 = lVar11 + -2;
    } while (uVar2 == uVar3);
    uVar15 = (ulong)CONCAT31((int3)((ulong)local_58 >> 8),(byte)local_58 & bVar17 == 0);
    bVar17 = (uint_fast8_t)puVar10 + 1;
    puVar10 = (uintwide_t<256U,_unsigned_short,_void,_false> *)(ulong)bVar17;
    local_b8.elems = aVar19.elems;
  } while (bVar17 != 0xe);
  iVar18 = 2;
  do {
    aVar19.elems = (value_type_conflict3  [8])
                   generate_wide_integer_value<math::wide_integer::uintwide_t<128u,unsigned_short,void,false>>
                             (true,dec,0x26);
    local_d8.values.super_array<unsigned_short,_16UL>.elems._0_16_ = aVar19.elems;
    peVar12 = math::wide_integer::uintwide_t<128u,unsigned_short,void,false>::operator>>=
                        ((uintwide_t<128u,unsigned_short,void,false> *)&local_d8,iVar18);
    local_58 = *(undefined8 *)(peVar12->values).super_array<unsigned_short,_8UL>.elems;
    uStack_50 = *(undefined8 *)((peVar12->values).super_array<unsigned_short,_8UL>.elems + 4);
    local_d8.values.super_array<unsigned_short,_16UL>.elems[8] = 0;
    local_d8.values.super_array<unsigned_short,_16UL>.elems[9] = 0;
    local_d8.values.super_array<unsigned_short,_16UL>.elems[10] = 0;
    local_d8.values.super_array<unsigned_short,_16UL>.elems[0xb] = 0;
    local_d8.values.super_array<unsigned_short,_16UL>.elems[0xc] = 0;
    local_d8.values.super_array<unsigned_short,_16UL>.elems[0xd] = 0;
    local_d8.values.super_array<unsigned_short,_16UL>.elems[0xe] = 0;
    local_d8.values.super_array<unsigned_short,_16UL>.elems[0xf] = 0;
    local_d8.values.super_array<unsigned_short,_16UL>.elems._0_16_ = aVar19.elems;
    peVar13 = math::wide_integer::uintwide_t<256u,unsigned_short,void,false>::operator>>=
                        ((uintwide_t<256u,unsigned_short,void,false> *)&local_d8,iVar18);
    local_b8.elems =
         *(value_type_conflict3 (*) [8])(peVar13->values).super_array<unsigned_short,_16UL>.elems;
    local_a8._0_8_ = *(undefined8 *)((peVar13->values).super_array<unsigned_short,_16UL>.elems + 8);
    local_a8._8_8_ =
         *(undefined8 *)((peVar13->values).super_array<unsigned_short,_16UL>.elems + 0xc);
    local_d8.values.super_array<unsigned_short,_16UL>.elems._8_8_ = uStack_50;
    local_d8.values.super_array<unsigned_short,_16UL>.elems._0_8_ = local_58;
    local_d8.values.super_array<unsigned_short,_16UL>.elems[8] = 0;
    local_d8.values.super_array<unsigned_short,_16UL>.elems[9] = 0;
    local_d8.values.super_array<unsigned_short,_16UL>.elems[10] = 0;
    local_d8.values.super_array<unsigned_short,_16UL>.elems[0xb] = 0;
    local_d8.values.super_array<unsigned_short,_16UL>.elems[0xc] = 0;
    local_d8.values.super_array<unsigned_short,_16UL>.elems[0xd] = 0;
    local_d8.values.super_array<unsigned_short,_16UL>.elems[0xe] = 0;
    local_d8.values.super_array<unsigned_short,_16UL>.elems[0xf] = 0;
    lVar11 = 0x1e;
    do {
      bVar17 = 0;
      if (lVar11 == -2) break;
      uVar2 = *(ushort *)
               ((long)(((representation_type *)&local_d8)->super_array<unsigned_short,_8UL>).elems +
               lVar11);
      uVar3 = *(ushort *)((long)local_b8.elems + lVar11);
      bVar17 = -(uVar2 <= uVar3) | 1;
      lVar11 = lVar11 + -2;
    } while (uVar2 == uVar3);
    uVar15 = (ulong)((byte)uVar15 & bVar17 == 0);
    iVar18 = iVar18 + 1;
  } while (iVar18 != 0x28);
  iVar18 = 0x3ea;
  do {
    aVar19.elems = (value_type_conflict3  [8])
                   generate_wide_integer_value<math::wide_integer::uintwide_t<128u,unsigned_short,void,false>>
                             (true,dec,0x26);
    local_d8.values.super_array<unsigned_short,_16UL>.elems._0_16_ = aVar19.elems;
    peVar12 = math::wide_integer::uintwide_t<128u,unsigned_short,void,false>::operator>>=
                        ((uintwide_t<128u,unsigned_short,void,false> *)&local_d8,iVar18);
    local_88.values.super_array<unsigned_short,_16UL>.elems._0_16_ =
         *(undefined1 (*) [16])(peVar12->values).super_array<unsigned_short,_8UL>.elems;
    local_d8.values.super_array<unsigned_short,_16UL>.elems[8] = 0;
    local_d8.values.super_array<unsigned_short,_16UL>.elems[9] = 0;
    local_d8.values.super_array<unsigned_short,_16UL>.elems[10] = 0;
    local_d8.values.super_array<unsigned_short,_16UL>.elems[0xb] = 0;
    local_d8.values.super_array<unsigned_short,_16UL>.elems[0xc] = 0;
    local_d8.values.super_array<unsigned_short,_16UL>.elems[0xd] = 0;
    local_d8.values.super_array<unsigned_short,_16UL>.elems[0xe] = 0;
    local_d8.values.super_array<unsigned_short,_16UL>.elems[0xf] = 0;
    local_d8.values.super_array<unsigned_short,_16UL>.elems._0_16_ = aVar19.elems;
    peVar13 = math::wide_integer::uintwide_t<256u,unsigned_short,void,false>::operator>>=
                        ((uintwide_t<256u,unsigned_short,void,false> *)&local_d8,iVar18);
    local_b8.elems =
         *(value_type_conflict3 (*) [8])(peVar13->values).super_array<unsigned_short,_16UL>.elems;
    local_a8._0_8_ = *(undefined8 *)((peVar13->values).super_array<unsigned_short,_16UL>.elems + 8);
    local_a8._8_8_ =
         *(undefined8 *)((peVar13->values).super_array<unsigned_short,_16UL>.elems + 0xc);
    local_d8.values.super_array<unsigned_short,_16UL>.elems[0] =
         local_88.values.super_array<unsigned_short,_16UL>.elems[0];
    local_d8.values.super_array<unsigned_short,_16UL>.elems[1] =
         local_88.values.super_array<unsigned_short,_16UL>.elems[1];
    local_d8.values.super_array<unsigned_short,_16UL>.elems[2] =
         local_88.values.super_array<unsigned_short,_16UL>.elems[2];
    local_d8.values.super_array<unsigned_short,_16UL>.elems[3] =
         local_88.values.super_array<unsigned_short,_16UL>.elems[3];
    local_d8.values.super_array<unsigned_short,_16UL>.elems[4] =
         local_88.values.super_array<unsigned_short,_16UL>.elems[4];
    local_d8.values.super_array<unsigned_short,_16UL>.elems[5] =
         local_88.values.super_array<unsigned_short,_16UL>.elems[5];
    local_d8.values.super_array<unsigned_short,_16UL>.elems[6] =
         local_88.values.super_array<unsigned_short,_16UL>.elems[6];
    local_d8.values.super_array<unsigned_short,_16UL>.elems[7] =
         local_88.values.super_array<unsigned_short,_16UL>.elems[7];
    local_d8.values.super_array<unsigned_short,_16UL>.elems[8] = 0;
    local_d8.values.super_array<unsigned_short,_16UL>.elems[9] = 0;
    local_d8.values.super_array<unsigned_short,_16UL>.elems[10] = 0;
    local_d8.values.super_array<unsigned_short,_16UL>.elems[0xb] = 0;
    local_d8.values.super_array<unsigned_short,_16UL>.elems[0xc] = 0;
    local_d8.values.super_array<unsigned_short,_16UL>.elems[0xd] = 0;
    local_d8.values.super_array<unsigned_short,_16UL>.elems[0xe] = 0;
    local_d8.values.super_array<unsigned_short,_16UL>.elems[0xf] = 0;
    lVar11 = 0x1e;
    do {
      bVar17 = 0;
      if (lVar11 == -2) break;
      uVar2 = *(ushort *)
               ((long)(((representation_type *)&local_d8)->super_array<unsigned_short,_8UL>).elems +
               lVar11);
      uVar3 = *(ushort *)((long)local_b8.elems + lVar11);
      bVar17 = -(uVar2 <= uVar3) | 1;
      lVar11 = lVar11 + -2;
    } while (uVar2 == uVar3);
    if (bVar17 == 0) {
      auVar4._12_4_ = 0;
      auVar4._0_12_ = stack0xffffffffffffff6c;
      _local_98 = (value_type_conflict3  [8])(auVar4 << 0x20);
      eVar7 = math::wide_integer::operator==
                        ((uintwide_t<128U,_unsigned_short,_void,_false> *)&local_88,(int *)local_98)
      ;
      uVar15 = (ulong)(eVar7 & (byte)uVar15);
    }
    else {
      uVar15 = 0;
    }
    iVar18 = iVar18 + 1;
  } while (iVar18 != 0x3f4);
  iVar18 = 0;
  uVar5 = local_a8._0_8_;
  uVar6 = local_a8._8_8_;
  do {
    local_a8._8_8_ = uVar6;
    local_a8._0_8_ = uVar5;
    aVar19.elems = (value_type_conflict3  [8])
                   generate_wide_integer_value<math::wide_integer::uintwide_t<128u,unsigned_short,void,false>>
                             (true,dec,0x26);
    _local_98 = (value_type_conflict3  [8])
                generate_wide_integer_value<math::wide_integer::uintwide_t<128u,unsigned_short,void,false>>
                          (true,dec,0x26);
    local_d8.values.super_array<unsigned_short,_16UL>.elems[0] = aVar19.elems[0];
    local_d8.values.super_array<unsigned_short,_16UL>.elems[1] = aVar19.elems[1];
    local_d8.values.super_array<unsigned_short,_16UL>.elems[2] = aVar19.elems[2];
    local_d8.values.super_array<unsigned_short,_16UL>.elems[3] = aVar19.elems[3];
    local_d8.values.super_array<unsigned_short,_16UL>.elems[4] = aVar19.elems[4];
    local_d8.values.super_array<unsigned_short,_16UL>.elems[5] = aVar19.elems[5];
    local_d8.values.super_array<unsigned_short,_16UL>.elems[6] = aVar19.elems[6];
    local_d8.values.super_array<unsigned_short,_16UL>.elems[7] = aVar19.elems[7];
    lVar11 = 0;
    do {
      puVar1 = (ushort *)
               ((long)(((representation_type *)&local_d8)->super_array<unsigned_short,_8UL>).elems +
               lVar11);
      *puVar1 = *puVar1 ^ *(ushort *)(local_98 + lVar11);
      auVar4 = (undefined1  [16])local_d8.values.super_array<unsigned_short,_16UL>.elems._0_16_;
      lVar11 = lVar11 + 2;
    } while (lVar11 != 0x10);
    local_88.values.super_array<unsigned_short,_16UL>.elems[0] = local_98._0_2_;
    local_88.values.super_array<unsigned_short,_16UL>.elems[1] = local_98._2_2_;
    local_88.values.super_array<unsigned_short,_16UL>.elems[2] = local_98._4_2_;
    local_88.values.super_array<unsigned_short,_16UL>.elems[3] = local_98._6_2_;
    local_88.values.super_array<unsigned_short,_16UL>.elems[4] = local_98._8_2_;
    local_88.values.super_array<unsigned_short,_16UL>.elems[5] = local_98._10_2_;
    local_88.values.super_array<unsigned_short,_16UL>.elems[6] = local_98._12_2_;
    local_88.values.super_array<unsigned_short,_16UL>.elems[7] = local_98._14_2_;
    local_88.values.super_array<unsigned_short,_16UL>.elems[8] = 0;
    local_88.values.super_array<unsigned_short,_16UL>.elems[9] = 0;
    local_88.values.super_array<unsigned_short,_16UL>.elems[10] = 0;
    local_88.values.super_array<unsigned_short,_16UL>.elems[0xb] = 0;
    local_88.values.super_array<unsigned_short,_16UL>.elems[0xc] = 0;
    local_88.values.super_array<unsigned_short,_16UL>.elems[0xd] = 0;
    local_88.values.super_array<unsigned_short,_16UL>.elems[0xe] = 0;
    local_88.values.super_array<unsigned_short,_16UL>.elems[0xf] = 0;
    local_d8.values.super_array<unsigned_short,_16UL>.elems[0] = aVar19.elems[0];
    local_d8.values.super_array<unsigned_short,_16UL>.elems[1] = aVar19.elems[1];
    local_d8.values.super_array<unsigned_short,_16UL>.elems[2] = aVar19.elems[2];
    local_d8.values.super_array<unsigned_short,_16UL>.elems[3] = aVar19.elems[3];
    local_d8.values.super_array<unsigned_short,_16UL>.elems[4] = aVar19.elems[4];
    local_d8.values.super_array<unsigned_short,_16UL>.elems[5] = aVar19.elems[5];
    local_d8.values.super_array<unsigned_short,_16UL>.elems[6] = aVar19.elems[6];
    local_d8.values.super_array<unsigned_short,_16UL>.elems[7] = aVar19.elems[7];
    local_d8.values.super_array<unsigned_short,_16UL>.elems[8] = 0;
    local_d8.values.super_array<unsigned_short,_16UL>.elems[9] = 0;
    local_d8.values.super_array<unsigned_short,_16UL>.elems[10] = 0;
    local_d8.values.super_array<unsigned_short,_16UL>.elems[0xb] = 0;
    local_d8.values.super_array<unsigned_short,_16UL>.elems[0xc] = 0;
    local_d8.values.super_array<unsigned_short,_16UL>.elems[0xd] = 0;
    local_d8.values.super_array<unsigned_short,_16UL>.elems[0xe] = 0;
    local_d8.values.super_array<unsigned_short,_16UL>.elems[0xf] = 0;
    lVar11 = 0;
    do {
      puVar1 = (ushort *)
               ((long)(((representation_type *)&local_d8)->super_array<unsigned_short,_8UL>).elems +
               lVar11);
      *puVar1 = *puVar1 ^ *(ushort *)
                           ((long)((array<unsigned_short,_8UL> *)&local_88)->elems + lVar11);
      lVar11 = lVar11 + 2;
    } while (lVar11 != 0x20);
    uVar5._0_2_ = local_d8.values.super_array<unsigned_short,_16UL>.elems[8];
    uVar5._2_2_ = local_d8.values.super_array<unsigned_short,_16UL>.elems[9];
    uVar5._4_2_ = local_d8.values.super_array<unsigned_short,_16UL>.elems[10];
    uVar5._6_2_ = local_d8.values.super_array<unsigned_short,_16UL>.elems[0xb];
    uVar6._0_2_ = local_d8.values.super_array<unsigned_short,_16UL>.elems[0xc];
    uVar6._2_2_ = local_d8.values.super_array<unsigned_short,_16UL>.elems[0xd];
    uVar6._4_2_ = local_d8.values.super_array<unsigned_short,_16UL>.elems[0xe];
    uVar6._6_2_ = local_d8.values.super_array<unsigned_short,_16UL>.elems[0xf];
    local_a8[0] = local_d8.values.super_array<unsigned_short,_16UL>.elems[8];
    local_a8[1] = local_d8.values.super_array<unsigned_short,_16UL>.elems[9];
    local_a8[2] = local_d8.values.super_array<unsigned_short,_16UL>.elems[10];
    local_a8[3] = local_d8.values.super_array<unsigned_short,_16UL>.elems[0xb];
    local_a8[4] = local_d8.values.super_array<unsigned_short,_16UL>.elems[0xc];
    local_a8[5] = local_d8.values.super_array<unsigned_short,_16UL>.elems[0xd];
    local_a8[6] = local_d8.values.super_array<unsigned_short,_16UL>.elems[0xe];
    local_a8[7] = local_d8.values.super_array<unsigned_short,_16UL>.elems[0xf];
    local_b8.elems[0] = local_d8.values.super_array<unsigned_short,_16UL>.elems[0];
    local_b8.elems[1] = local_d8.values.super_array<unsigned_short,_16UL>.elems[1];
    local_b8.elems[2] = local_d8.values.super_array<unsigned_short,_16UL>.elems[2];
    local_b8.elems[3] = local_d8.values.super_array<unsigned_short,_16UL>.elems[3];
    local_b8.elems[4] = local_d8.values.super_array<unsigned_short,_16UL>.elems[4];
    local_b8.elems[5] = local_d8.values.super_array<unsigned_short,_16UL>.elems[5];
    local_b8.elems[6] = local_d8.values.super_array<unsigned_short,_16UL>.elems[6];
    local_b8.elems[7] = local_d8.values.super_array<unsigned_short,_16UL>.elems[7];
    local_d8.values.super_array<unsigned_short,_16UL>.elems._0_16_ = auVar4;
    local_d8.values.super_array<unsigned_short,_16UL>.elems[8] = 0;
    local_d8.values.super_array<unsigned_short,_16UL>.elems[9] = 0;
    local_d8.values.super_array<unsigned_short,_16UL>.elems[10] = 0;
    local_d8.values.super_array<unsigned_short,_16UL>.elems[0xb] = 0;
    local_d8.values.super_array<unsigned_short,_16UL>.elems[0xc] = 0;
    local_d8.values.super_array<unsigned_short,_16UL>.elems[0xd] = 0;
    local_d8.values.super_array<unsigned_short,_16UL>.elems[0xe] = 0;
    local_d8.values.super_array<unsigned_short,_16UL>.elems[0xf] = 0;
    pvVar14 = (value_type_conflict3 *)0x1e;
    do {
      bVar17 = 0;
      if ((uintwide_t<256U,_unsigned_short,_void,_false> *)pvVar14 ==
          (uintwide_t<256U,_unsigned_short,_void,_false> *)0xfffffffffffffffe) break;
      uVar2 = *(ushort *)
               ((long)(((representation_type *)&local_d8)->super_array<unsigned_short,_8UL>).elems +
               (long)pvVar14);
      uVar3 = *(ushort *)((long)local_b8.elems + (long)pvVar14);
      bVar17 = -(uVar2 <= uVar3) | 1;
      pvVar14 = pvVar14 + -1;
    } while (uVar2 == uVar3);
    uVar15 = (ulong)((byte)uVar15 & bVar17 == 0);
    iVar18 = iVar18 + 1;
  } while (iVar18 != 0x18);
  iVar18 = 0;
  do {
    _local_98 = (value_type_conflict3  [8])
                generate_wide_integer_value<math::wide_integer::uintwide_t<128u,unsigned_short,void,false>>
                          (true,dec,0x26);
    local_68.elems =
         (value_type_conflict3  [8])
         generate_wide_integer_value<math::wide_integer::uintwide_t<128u,unsigned_short,void,false>>
                   (true,dec,0x26);
    aVar19.elems = (value_type_conflict3  [8])
                   math::wide_integer::gcd<128u,unsigned_short,void,false>
                             ((uintwide_t<128U,_unsigned_short,_void,_false> *)local_98,
                              (uintwide_t<128U,_unsigned_short,_void,_false> *)&local_68);
    local_b8.elems[0] = local_98._0_2_;
    local_b8.elems[1] = local_98._2_2_;
    local_b8.elems[2] = local_98._4_2_;
    local_b8.elems[3] = local_98._6_2_;
    local_b8.elems[4] = avStack_90[0];
    local_b8.elems[5] = avStack_90[1];
    local_b8.elems[6] = avStack_90[2];
    local_b8.elems[7] = avStack_90[3];
    local_a8[0] = 0;
    local_a8[1] = 0;
    local_a8[2] = 0;
    local_a8[3] = 0;
    local_a8[4] = 0;
    local_a8[5] = 0;
    local_a8[6] = 0;
    local_a8[7] = 0;
    local_88.values.super_array<unsigned_short,_16UL>.elems[0] = local_68.elems[0];
    local_88.values.super_array<unsigned_short,_16UL>.elems[1] = local_68.elems[1];
    local_88.values.super_array<unsigned_short,_16UL>.elems[2] = local_68.elems[2];
    local_88.values.super_array<unsigned_short,_16UL>.elems[3] = local_68.elems[3];
    local_88.values.super_array<unsigned_short,_16UL>.elems[4] = local_68.elems[4];
    local_88.values.super_array<unsigned_short,_16UL>.elems[5] = local_68.elems[5];
    local_88.values.super_array<unsigned_short,_16UL>.elems[6] = local_68.elems[6];
    local_88.values.super_array<unsigned_short,_16UL>.elems[7] = local_68.elems[7];
    local_88.values.super_array<unsigned_short,_16UL>.elems[8] = 0;
    local_88.values.super_array<unsigned_short,_16UL>.elems[9] = 0;
    local_88.values.super_array<unsigned_short,_16UL>.elems[10] = 0;
    local_88.values.super_array<unsigned_short,_16UL>.elems[0xb] = 0;
    local_88.values.super_array<unsigned_short,_16UL>.elems[0xc] = 0;
    local_88.values.super_array<unsigned_short,_16UL>.elems[0xd] = 0;
    local_88.values.super_array<unsigned_short,_16UL>.elems[0xe] = 0;
    local_88.values.super_array<unsigned_short,_16UL>.elems[0xf] = 0;
    math::wide_integer::gcd<256u,unsigned_short,void,false>
              (&local_d8,(wide_integer *)&local_b8,&local_88,
               (uintwide_t<256U,_unsigned_short,_void,_false> *)pvVar14);
    local_a8[0] = 0;
    local_a8[1] = 0;
    local_a8[2] = 0;
    local_a8[3] = 0;
    local_a8[4] = 0;
    local_a8[5] = 0;
    local_a8[6] = 0;
    local_a8[7] = 0;
    lVar11 = 0x1e;
    do {
      bVar17 = 0;
      if (lVar11 == -2) break;
      uVar2 = *(ushort *)((long)local_b8.elems + lVar11);
      pvVar14 = (value_type_conflict3 *)(ulong)uVar2;
      uVar3 = *(ushort *)
               ((long)(((representation_type *)&local_d8)->super_array<unsigned_short,_8UL>).elems +
               lVar11);
      bVar17 = -(uVar2 <= uVar3) | 1;
      lVar11 = lVar11 + -2;
    } while (uVar2 == uVar3);
    uVar15 = (ulong)((byte)uVar15 & bVar17 == 0);
    iVar18 = iVar18 + 1;
    local_b8.elems = aVar19.elems;
  } while (iVar18 != 0x20);
  cVar16 = '\0';
  do {
    local_b8.elems =
         (value_type_conflict3  [8])
         generate_wide_integer_value<math::wide_integer::uintwide_t<128u,unsigned_short,void,true>>
                   (false,dec,0x1f);
    math::wide_integer::uintwide_t<256U,_unsigned_short,_void,_false>::
    uintwide_t<128U,_true,_nullptr>
              (&local_d8,(uintwide_t<128U,_unsigned_short,_void,_true> *)&local_b8);
    local_88.values.super_array<unsigned_short,_16UL>.elems[0] =
         local_d8.values.super_array<unsigned_short,_16UL>.elems[0];
    local_88.values.super_array<unsigned_short,_16UL>.elems[1] =
         local_d8.values.super_array<unsigned_short,_16UL>.elems[1];
    local_88.values.super_array<unsigned_short,_16UL>.elems[2] =
         local_d8.values.super_array<unsigned_short,_16UL>.elems[2];
    local_88.values.super_array<unsigned_short,_16UL>.elems[3] =
         local_d8.values.super_array<unsigned_short,_16UL>.elems[3];
    local_88.values.super_array<unsigned_short,_16UL>.elems[4] =
         local_d8.values.super_array<unsigned_short,_16UL>.elems[4];
    local_88.values.super_array<unsigned_short,_16UL>.elems[5] =
         local_d8.values.super_array<unsigned_short,_16UL>.elems[5];
    local_88.values.super_array<unsigned_short,_16UL>.elems[6] =
         local_d8.values.super_array<unsigned_short,_16UL>.elems[6];
    local_88.values.super_array<unsigned_short,_16UL>.elems[7] =
         local_d8.values.super_array<unsigned_short,_16UL>.elems[7];
    auVar4 = (undefined1  [16])local_88.values.super_array<unsigned_short,_16UL>.elems._0_16_;
    local_88.values.super_array<unsigned_short,_16UL>.elems[7] =
         local_d8.values.super_array<unsigned_short,_16UL>.elems[7];
    if ((short)(local_b8.elems[7] ^ local_88.values.super_array<unsigned_short,_16UL>.elems[7]) < 0)
    {
      uVar15 = 0;
    }
    else {
      lVar11 = 0xe;
      do {
        bVar17 = 0;
        if (lVar11 == -2) break;
        uVar2 = *(ushort *)((long)local_b8.elems + lVar11);
        uVar3 = *(ushort *)((long)((array<unsigned_short,_8UL> *)&local_88)->elems + lVar11);
        bVar17 = -(uVar2 <= uVar3) | 1;
        lVar11 = lVar11 + -2;
      } while (uVar2 == uVar3);
      uVar15 = (ulong)((byte)uVar15 & bVar17 == 0);
    }
    cVar16 = cVar16 + '\x01';
    local_88.values.super_array<unsigned_short,_16UL>.elems._0_16_ = auVar4;
    if (cVar16 == ' ') {
      return SUB81(uVar15,0);
    }
  } while( true );
}

Assistant:

auto test_ops_n_half_by_n_half() -> bool
{
  auto result_is_ok = true;

  for(auto   i = static_cast<unsigned>(UINT8_C(0));
             i < static_cast<unsigned>(UINT8_C(24));
           ++i)
  {
    const auto left_half =
      generate_wide_integer_value<local_uintwide_t_half_unsigned_type>
      (
        true,
        local_base::hex,
        static_cast<int>
        (
            static_cast<int>(std::numeric_limits<local_uintwide_t_half_unsigned_type>::digits / 8)
          - static_cast<int>(INT8_C(1))
        )
      );

    const auto right_half =
      generate_wide_integer_value<local_uintwide_t_half_unsigned_type>
      (
        true,
        local_base::hex,
        static_cast<int>
        (
            static_cast<int>(std::numeric_limits<local_uintwide_t_half_unsigned_type>::digits / 8)
          - static_cast<int>(INT8_C(1))
        )
      );

    const auto prod_half = left_half * right_half;
    const auto prod_ctrl =   local_uintwide_t_small_unsigned_type(left_half)
                           * local_uintwide_t_small_unsigned_type(right_half);


    const auto result_multiply_is_ok = (local_uintwide_t_small_unsigned_type(prod_half) == prod_ctrl);

    result_is_ok = (result_multiply_is_ok && result_is_ok);
  }

  for(auto   i = static_cast<unsigned>(UINT8_C(2));
             i < static_cast<unsigned>(UINT8_C(8));
           ++i)
  {
    const auto x_half =
      generate_wide_integer_value<local_uintwide_t_half_unsigned_type>
      (
        true,
        local_base::hex,
        static_cast<int>(INT8_C(4))
      );

    const auto pow_half = pow(x_half, i);

    const auto pow_ctrl = pow(local_uintwide_t_small_unsigned_type(x_half), i);

    const auto result_pow_is_ok = (local_uintwide_t_small_unsigned_type(pow_half) == pow_ctrl);

    result_is_ok = (result_pow_is_ok && result_is_ok);
  }

  for(auto   i = static_cast<unsigned>(UINT8_C(0));
             i < static_cast<unsigned>(UINT8_C(8));
           ++i)
  {
    const auto arg_half  =   generate_wide_integer_value<local_uintwide_t_half_unsigned_type>();

    const auto zero_half =   generate_wide_integer_value<local_uintwide_t_half_unsigned_type>()
                           * local_uintwide_t_half_unsigned_type(zero_as_small_unsigned_type());

    const auto pow_zero_half = pow(arg_half, zero_half);

    const auto pow_zero_ctrl = pow(local_uintwide_t_small_unsigned_type(arg_half), local_uintwide_t_small_unsigned_type(zero_half));

    const auto result_pow_zero_is_ok = ((local_uintwide_t_small_unsigned_type(pow_zero_half) == pow_zero_ctrl) && (pow_zero_half == 1));

    result_is_ok = (result_pow_zero_is_ok && result_is_ok);
  }

  for(auto   i = static_cast<std::uint_fast8_t>(UINT8_C(3));
             i < static_cast<std::uint_fast8_t>(UINT8_C(14));
           ++i)
  {
    const auto x_half =
      generate_wide_integer_value<local_uintwide_t_half_unsigned_type>();

    const auto rootk_half = rootk(x_half, i);

    const auto rootk_ctrl = rootk(local_uintwide_t_small_unsigned_type(x_half), i);

    const auto result_rootk_is_ok = (local_uintwide_t_small_unsigned_type(rootk_half) == rootk_ctrl);

    result_is_ok = (result_rootk_is_ok && result_is_ok);
  }

  for(auto   i = static_cast<signed>(INT8_C(2));
             i < static_cast<signed>(INT8_C(40));
           ++i)
  {
    const auto x_half = generate_wide_integer_value<local_uintwide_t_half_unsigned_type>();

    const auto shr_half = x_half >> i;

    const auto shr_ctrl = local_uintwide_t_small_unsigned_type(x_half) >> i;

    const auto result_shr_is_ok = (local_uintwide_t_small_unsigned_type(shr_half) == shr_ctrl);

    result_is_ok = (result_shr_is_ok && result_is_ok);
  }

  for(auto   i = static_cast<signed>(INT16_C(1002));
             i < static_cast<signed>(INT16_C(1012));
           ++i)
  {
    const auto x_half = generate_wide_integer_value<local_uintwide_t_half_unsigned_type>();

    const auto shr_half = x_half >> i;

    const auto shr_ctrl = local_uintwide_t_small_unsigned_type(x_half) >> i;

    const auto result_shr_is_ok = ((local_uintwide_t_small_unsigned_type(shr_half) == shr_ctrl) && (shr_half == 0));

    result_is_ok = (result_shr_is_ok && result_is_ok);
  }

  for(auto   i = static_cast<unsigned>(UINT8_C(0));
             i < static_cast<unsigned>(UINT8_C(24));
           ++i)
  {
    const auto left_half = generate_wide_integer_value<local_uintwide_t_half_unsigned_type>();

    const auto right_half = generate_wide_integer_value<local_uintwide_t_half_unsigned_type>();

    const auto xor_half = left_half ^ right_half;
    const auto xor_ctrl = (  local_uintwide_t_small_unsigned_type(left_half)
                           ^ local_uintwide_t_small_unsigned_type(right_half));


    const auto result_xor_is_ok = (local_uintwide_t_small_unsigned_type(xor_half) == xor_ctrl);

    result_is_ok = (result_xor_is_ok && result_is_ok);
  }

  for(auto   i = static_cast<unsigned>(UINT8_C(0));
             i < static_cast<unsigned>(UINT8_C(32));
           ++i)
  {
    const auto left_half  = generate_wide_integer_value<local_uintwide_t_half_unsigned_type>();
    const auto right_half = generate_wide_integer_value<local_uintwide_t_half_unsigned_type>();

    const auto gcd_half = gcd(left_half, right_half);
    const auto gcd_ctrl = gcd(local_uintwide_t_small_unsigned_type(left_half), local_uintwide_t_small_unsigned_type(right_half));

    const auto result_gcd_is_ok = (local_uintwide_t_small_unsigned_type(gcd_half) == gcd_ctrl);

    result_is_ok = (result_gcd_is_ok && result_is_ok);
  }

  for(auto   i = static_cast<std::uint_fast8_t>(UINT8_C(0));
             i < static_cast<std::uint_fast8_t>(UINT8_C(32));
           ++i)
  {
    const auto x_half_signed =
      generate_wide_integer_value<local_uintwide_t_half_signed_type>
      (
        false,
        local_base::dec,
        static_cast<int>(std::numeric_limits<local_uintwide_t_half_signed_type>::digits10 - 7)
      );

    const auto x_small_unsigned = local_uintwide_t_small_unsigned_type(x_half_signed);
    const auto x_ctrl_signed    = static_cast<local_uintwide_t_half_signed_type>(x_small_unsigned);

    const auto result_convert_is_ok = (x_half_signed == x_ctrl_signed);

    result_is_ok = (result_convert_is_ok && result_is_ok);
  }

  return result_is_ok;
}